

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

char * lua_setupvalue(lua_State *L,int funcindex,int n)

{
  ushort uVar1;
  StkId pTVar2;
  int *piVar3;
  int iVar4;
  TValue *fi;
  char *pcVar5;
  ravi_type_map type;
  UpVal *uv;
  CClosure *owner;
  TValue *val;
  TString *usertype;
  ravi_type_map local_3c;
  UpVal *local_38;
  CClosure *local_30;
  TValue *local_28;
  TString *local_20;
  
  local_28 = (TValue *)0x0;
  local_30 = (CClosure *)0x0;
  local_38 = (UpVal *)0x0;
  iVar4 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar4 + 1;
  if (iVar4 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x658,"const char *lua_setupvalue(lua_State *, int, int)");
  }
  fi = index2addr(L,funcindex);
  if ((long)L->top - (long)L->ci->func < 0x11) {
    __assert_fail("((1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x65a,"const char *lua_setupvalue(lua_State *, int, int)");
  }
  pcVar5 = aux_upvalue(fi,n,&local_28,&local_30,&local_38,&local_3c,&local_20);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    iVar4 = raviV_checktype(L,L->top + -1,local_3c,local_20);
    if (iVar4 == 0) {
      pcVar5 = (char *)0x0;
    }
  }
  if (pcVar5 != (char *)0x0) {
    pTVar2 = L->top;
    L->top = pTVar2 + -1;
    local_28->value_ = pTVar2[-1].value_;
    uVar1 = pTVar2[-1].tt_;
    local_28->tt_ = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)((local_28->value_).gc)->tt ||
        ((L != (lua_State *)0x0 &&
         ((((local_28->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x66a,"const char *lua_setupvalue(lua_State *, int, int)");
    }
    if (local_30 == (CClosure *)0x0) {
      if ((local_38 != (UpVal *)0x0 && (short)uVar1 < 0) && (local_38->v == (TValue *)&local_38->u))
      {
        luaC_upvalbarrier_(L,(local_28->value_).gc);
      }
    }
    else if ((((short)uVar1 < 0) && ((local_30->marked & 0x20) != 0)) &&
            ((((local_28->value_).gc)->marked & 0x18) != 0)) {
      if (9 < (local_30->tt & 0xe)) {
        __assert_fail("(((owner)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x66b,"const char *lua_setupvalue(lua_State *, int, int)");
      }
      luaC_barrier_(L,(GCObject *)local_30,(local_28->value_).gc);
    }
  }
  piVar3 = *(int **)&L[-1].hookmask;
  *piVar3 = *piVar3 + -1;
  if (*piVar3 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x66e,"const char *lua_setupvalue(lua_State *, int, int)");
  }
  return pcVar5;
}

Assistant:

LUA_API const char *lua_setupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val = NULL;  /* to avoid warnings */
  CClosure *owner = NULL;
  UpVal *uv = NULL;
  StkId fi;
  ravi_type_map type; /* RAVI upvalue type will be obtained if possible */
  TString *usertype;
  lua_lock(L);
  fi = index2addr(L, funcindex);
  api_checknelems(L, 1);
  name = aux_upvalue(fi, n, &val, &owner, &uv, &type, &usertype);
  if (name) {
    /* RAVI extension
    ** We need to ensure that this function does
    ** not subvert the types of local variables
    */
  
    StkId input = L->top - 1;
    int compatible = raviV_checktype(L, input, type, usertype);
          
    if (!compatible)
      name = NULL;
  }
  if (name) {
    L->top--;
    setobj(L, val, L->top);
    if (owner) { luaC_barrier(L, owner, val); }
    else if (uv) { luaC_upvalbarrier(L, uv, val); }
  }
  lua_unlock(L);
  return name;
}